

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

void __thiscall network_pimpl::remove_client(network_pimpl *this,string *value)

{
  _Alloc_hider _Var1;
  int iVar2;
  iterator __position;
  iterator __position_00;
  bool bVar3;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar4;
  string local_50;
  
  __position._M_current =
       (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (__position._M_current !=
      (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      EventDataType::getOrigin_abi_cxx11_(&local_50,__position._M_current);
      _Var1._M_p = local_50._M_dataplus._M_p;
      if (local_50._M_string_length == value->_M_string_length) {
        if (local_50._M_string_length == 0) {
          bVar3 = true;
        }
        else {
          iVar2 = bcmp(local_50._M_dataplus._M_p,(value->_M_dataplus)._M_p,local_50._M_string_length
                      );
          bVar3 = iVar2 == 0;
        }
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_50.field_2) {
        operator_delete(_Var1._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        __position = std::vector<EventDataType,_std::allocator<EventDataType>_>::_M_erase
                               (&this->events,__position);
      }
      else {
        __position._M_current = __position._M_current + 1;
      }
    } while (__position._M_current !=
             (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  __position_00._M_current =
       (this->hfdts).super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>._M_impl
       .super__Vector_impl_data._M_start;
  if (__position_00._M_current !=
      (this->hfdts).super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      HighFreqDataType::getOrigin_abi_cxx11_(&local_50,__position_00._M_current);
      _Var1._M_p = local_50._M_dataplus._M_p;
      if (local_50._M_string_length == value->_M_string_length) {
        if (local_50._M_string_length == 0) {
          bVar3 = true;
        }
        else {
          iVar2 = bcmp(local_50._M_dataplus._M_p,(value->_M_dataplus)._M_p,local_50._M_string_length
                      );
          bVar3 = iVar2 == 0;
        }
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_50.field_2) {
        operator_delete(_Var1._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        __position_00 =
             std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>::_M_erase
                       (&this->hfdts,__position_00);
      }
      else {
        __position_00._M_current = __position_00._M_current + 1;
      }
    } while (__position_00._M_current !=
             (this->hfdts).super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  pVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::equal_range(&(this->clients)._M_t,value);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_aux(&(this->clients)._M_t,(_Base_ptr)pVar4.first._M_node,
                 (_Base_ptr)pVar4.second._M_node);
  return;
}

Assistant:

void network_pimpl::remove_client(const std::string &value){
    //First remove all events and hfdt's related to this client
    for(auto it = events.begin(); it != events.end(); ){
        if(it->getOrigin() == value)
            it = events.erase(it);
        else ++it;
    }
    //Remove hfdt's
    for(auto it = hfdts.begin(); it != hfdts.end(); ){
        if(it->getOrigin() == value)
            it = hfdts.erase(it);
        else ++it;
    }
    //Remove name from clients
    clients.erase(value);
}